

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::GetWindowAlwaysWantOwnTabBar(ImGuiWindow *window)

{
  ImGuiContext *g;
  ImGuiWindow *window_local;
  bool local_1;
  
  if ((((((GImGui->IO).ConfigDockingAlwaysTabBar & 1U) == 0) &&
       (((window->WindowClass).DockingAlwaysTabBar & 1U) == 0)) ||
      ((window->Flags & 0x1200001U) != 0)) || ((window->IsFallbackWindow & 1U) != 0)) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::GetWindowAlwaysWantOwnTabBar(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.IO.ConfigDockingAlwaysTabBar || window->WindowClass.DockingAlwaysTabBar)
        if ((window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoDocking)) == 0)
            if (!window->IsFallbackWindow)    // We don't support AlwaysTabBar on the fallback/implicit window to avoid unused dock-node overhead/noise
                return true;
    return false;
}